

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::GetAmpStatus(AmpIO *this,uint index)

{
  uint32_t uVar1;
  quadlet_t *pqVar2;
  uint uVar3;
  
  if (index < this->NumMotors) {
    uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    pqVar2 = this->ReadBuffer + (this->MOTOR_STATUS_OFFSET + index);
    if (uVar1 < 8) {
      pqVar2 = this->ReadBuffer + 1;
    }
    uVar3 = 0x20000000;
    if (uVar1 < 8) {
      uVar3 = 0x100 << ((byte)index & 0x1f);
    }
    return (*pqVar2 & uVar3) != 0;
  }
  return false;
}

Assistant:

bool AmpIO::GetAmpStatus(unsigned int index) const
{
    if (index >= NumMotors)
        return false;

    bool ret = false;
    if (GetFirmwareVersion() < 8) {
        uint32_t mask = (0x00000100 << index);
        ret = GetStatus()&mask;
    }
    else {
        ret = ReadBuffer[MOTOR_STATUS_OFFSET + index] & MSTAT_AMP_STATUS;
    }
    return ret;
}